

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O2

int Gia_ManAppendCi(Gia_Man_t *p)

{
  ulong uVar1;
  Vec_Int_t *p_00;
  int iVar2;
  Gia_Obj_t *pObj;
  
  pObj = Gia_ManAppendObj(p);
  uVar1 = *(ulong *)pObj;
  *(ulong *)pObj = uVar1 | 0x9fffffff;
  *(ulong *)pObj =
       uVar1 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
  p_00 = p->vCis;
  iVar2 = Gia_ObjId(p,pObj);
  Vec_IntPush(p_00,iVar2);
  iVar2 = Gia_ObjId(p,pObj);
  return iVar2 * 2;
}

Assistant:

static inline int Gia_ManAppendCi( Gia_Man_t * p )  
{ 
    Gia_Obj_t * pObj = Gia_ManAppendObj( p );
    pObj->fTerm = 1;
    pObj->iDiff0 = GIA_NONE;
    pObj->iDiff1 = Vec_IntSize( p->vCis );
    Vec_IntPush( p->vCis, Gia_ObjId(p, pObj) );
    return Gia_ObjId( p, pObj ) << 1;
}